

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 uVar2;
  ggml_cgraph *pgVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  char *in_stack_00000018;
  vector<yolo_image,_std::allocator<yolo_image>_> *in_stack_00000078;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000080;
  float in_stack_0000008c;
  yolo_model *in_stack_00000090;
  ggml_cgraph *in_stack_00000098;
  yolo_image *in_stack_000000a0;
  int64_t t_detect_ms;
  int64_t t_start_ms;
  ggml_gallocr_t allocr;
  ggml_cgraph *gf;
  ggml_context *ctx_cgraph;
  ggml_init_params params0;
  vector<yolo_image,_std::allocator<yolo_image>_> alphabet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  yolo_image img;
  yolo_params params;
  yolo_model model;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int quality;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  yolo_image *in_stack_fffffffffffffde8;
  FILE *pFVar8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  yolo_image *in_stack_fffffffffffffe00;
  yolo_params *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  char **in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  vector<yolo_image,_std::allocator<yolo_image>_> *in_stack_fffffffffffffed8;
  yolo_model *model_00;
  undefined1 uVar9;
  undefined7 in_stack_fffffffffffffee1;
  yolo_model *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  undefined8 local_18;
  int local_4;
  
  ggml_time_init();
  yolo_model::yolo_model
            ((yolo_model *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  yolo_params::yolo_params(in_stack_fffffffffffffe10);
  bVar1 = yolo_params_parse(in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
                            (yolo_params *)
                            CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  if (bVar1) {
    bVar1 = load_model(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (bVar1) {
      yolo_image::yolo_image
                (in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 (int)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
      std::__cxx11::string::c_str();
      bVar1 = load_image(in_stack_fffffffffffffdf8,
                         (yolo_image *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                        );
      pFVar8 = _stderr;
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x10951e);
        bVar1 = load_labels(in_stack_00000018,in_stack_00000010);
        if (bVar1) {
          std::vector<yolo_image,_std::allocator<yolo_image>_>::vector
                    ((vector<yolo_image,_std::allocator<yolo_image>_> *)0x1095b0);
          bVar1 = load_alphabet(in_stack_fffffffffffffed8);
          if (bVar1) {
            ggml_tensor_overhead();
            ggml_graph_overhead();
            model_00 = (yolo_model *)0x0;
            uVar9 = 1;
            quality = (int)((uint7)in_stack_fffffffffffffee1 >> 0x18);
            uStack_150 = 0;
            uStack_14c = 0;
            uVar2 = ggml_init();
            pgVar3 = build_graph((ggml_context *)CONCAT71(in_stack_fffffffffffffee1,uVar9),model_00)
            ;
            uVar4 = ggml_backend_get_default_buffer_type(in_stack_ffffffffffffffd8);
            uVar4 = ggml_gallocr_new(uVar4);
            ggml_gallocr_alloc_graph(uVar4,pgVar3);
            lVar5 = ggml_time_ms();
            detect(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                   in_stack_00000080,in_stack_00000078);
            lVar6 = ggml_time_ms();
            std::__cxx11::string::c_str();
            bVar1 = save_image(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,quality);
            if (bVar1) {
              uVar7 = std::__cxx11::string::c_str();
              printf("Detected objects saved in \'%s\' (time: %f sec.)\n",
                     SUB84((double)((float)(lVar6 - lVar5) / 1000.0),0),uVar7);
              ggml_free(uVar2);
              ggml_gallocr_free(uVar4);
              ggml_free(local_18);
              ggml_backend_buffer_free(local_20);
              ggml_backend_free(in_stack_ffffffffffffffd8);
              local_4 = 0;
              in_stack_fffffffffffffdd0 = uStack_150;
              in_stack_fffffffffffffdd4 = uStack_14c;
            }
            else {
              pFVar8 = _stderr;
              uVar2 = std::__cxx11::string::c_str();
              fprintf(pFVar8,"%s: failed to save image to \'%s\'\n","main",uVar2);
              local_4 = 1;
              in_stack_fffffffffffffdd0 = uStack_150;
              in_stack_fffffffffffffdd4 = uStack_14c;
            }
          }
          else {
            fprintf(_stderr,"%s: failed to load alphabet\n","main");
            local_4 = 1;
          }
          std::vector<yolo_image,_std::allocator<yolo_image>_>::~vector
                    ((vector<yolo_image,_std::allocator<yolo_image>_> *)in_stack_fffffffffffffde0);
        }
        else {
          fprintf(_stderr,"%s: failed to load labels from \'data/coco.names\'\n","main");
          local_4 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffde0);
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"%s: failed to load image from \'%s\'\n","main",uVar2);
        local_4 = 1;
      }
      yolo_image::~yolo_image((yolo_image *)0x109926);
    }
    else {
      pFVar8 = _stderr;
      uVar2 = std::__cxx11::string::c_str();
      fprintf(pFVar8,"%s: failed to load model from \'%s\'\n","main",uVar2);
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  yolo_params::~yolo_params
            ((yolo_params *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  yolo_model::~yolo_model((yolo_model *)0x109951);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    ggml_time_init();
    yolo_model model;

    yolo_params params;
    if (!yolo_params_parse(argc, argv, params)) {
        return 1;
    }
    if (!load_model(params.model, model)) {
        fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
        return 1;
    }
    yolo_image img(0,0,0);
    if (!load_image(params.fname_inp.c_str(), img)) {
        fprintf(stderr, "%s: failed to load image from '%s'\n", __func__, params.fname_inp.c_str());
        return 1;
    }
    std::vector<std::string> labels;
    if (!load_labels("data/coco.names", labels)) {
        fprintf(stderr, "%s: failed to load labels from 'data/coco.names'\n", __func__);
        return 1;
    }
    std::vector<yolo_image> alphabet;
    if (!load_alphabet(alphabet)) {
        fprintf(stderr, "%s: failed to load alphabet\n", __func__);
        return 1;
    }

    struct ggml_init_params params0 = {
        /*.mem_size   =*/ ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead(),
        /*.mem_buffer =*/ NULL,
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };
    struct ggml_context * ctx_cgraph = ggml_init(params0);
    struct ggml_cgraph * gf = build_graph(ctx_cgraph, model);

    ggml_gallocr_t allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));
    ggml_gallocr_alloc_graph(allocr, gf);

    const int64_t t_start_ms = ggml_time_ms();
    detect(img, gf, model, params.thresh, labels, alphabet);
    const int64_t t_detect_ms = ggml_time_ms() - t_start_ms;
    if (!save_image(img, params.fname_out.c_str(), 80)) {
        fprintf(stderr, "%s: failed to save image to '%s'\n", __func__, params.fname_out.c_str());
        return 1;
    }
    printf("Detected objects saved in '%s' (time: %f sec.)\n", params.fname_out.c_str(), t_detect_ms / 1000.0f);

    ggml_free(ctx_cgraph);
    ggml_gallocr_free(allocr);
    ggml_free(model.ctx);
    ggml_backend_buffer_free(model.buffer);
    ggml_backend_free(model.backend);
    return 0;
}